

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O3

bool __thiscall DelayImpEntryWrapper::loadNextEntry(DelayImpEntryWrapper *this,size_t entryNum)

{
  ExeNodeWrapper *pEVar1;
  int iVar2;
  DelayImpFuncWrapper *this_00;
  void *pvVar3;
  undefined4 extraout_var;
  long *plVar4;
  size_t subField;
  bool bVar5;
  bool isOk;
  byte local_29;
  DelayImpFuncWrapper *local_28;
  
  this_00 = (DelayImpFuncWrapper *)operator_new(0x50);
  PENodeWrapper::PENodeWrapper
            ((PENodeWrapper *)this_00,(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.m_PE,
             (PENodeWrapper *)this,entryNum);
  (this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
  super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__ExeNodeWrapper_00154c78;
  this_00->parentDir = this;
  pvVar3 = DelayImpFuncWrapper::getFieldPtr(this_00,1,subField);
  if (pvVar3 == (void *)0x0) {
    (*(this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])(this_00);
    bVar5 = false;
  }
  else {
    local_29 = 0;
    iVar2 = (*(this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                      (this_00,0,0xffffffffffffffff,&local_29);
    bVar5 = (bool)(CONCAT44(extraout_var,iVar2) - 1U < 0xfffffffffffffffe & local_29);
    if (bVar5 == false) {
      (*(this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
        super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])(this_00);
    }
    else {
      local_28 = this_00;
      std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                 &(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                  entries,(ExeNodeWrapper **)&local_28);
      pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               parentNode;
      if (pEVar1 != (ExeNodeWrapper *)0x0) {
        plVar4 = (long *)__dynamic_cast(pEVar1,&ExeNodeWrapper::typeinfo,
                                        &DelayImpDirWrapper::typeinfo,0);
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 0x168))(plVar4,this_00);
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool DelayImpEntryWrapper::loadNextEntry(size_t entryNum)
 {
    DelayImpFuncWrapper* entry = new DelayImpFuncWrapper(this->m_PE, this, entryNum);
    if (entry->getPtr() == NULL) {
        delete entry;
        return false;
    }
    bool isOk = false;
    uint64_t thunk = entry->getNumValue(DelayImpFuncWrapper::NAMETHUNK_ADDR, &isOk);
    if (!isOk || thunk == INVALID_ADDR || thunk == 0) {
        delete entry;
        return false;
    }
    this->entries.push_back(entry);

    DelayImpDirWrapper *impDir = dynamic_cast<DelayImpDirWrapper*>(this->parentNode);
    if (impDir) impDir->addMapping(entry);
    return true;
 }